

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O3

void __thiscall
CoreML::TreeEnsembleClassifier::TreeEnsembleClassifier
          (TreeEnsembleClassifier *this,string *predictedClassOutputName,
          string *classProbabilityOutputName,string *description)

{
  ulong uVar1;
  element_type *peVar2;
  TypeUnion TVar3;
  ModelDescription *pMVar4;
  undefined8 *puVar5;
  Arena *pAVar6;
  Model *this_00;
  Model MStack_38;
  
  Model::Model(&MStack_38,description);
  TreeEnsembleBase::TreeEnsembleBase(&this->super_TreeEnsembleBase,&MStack_38,true);
  Model::~Model(&MStack_38);
  (this->super_TreeEnsembleBase).super_Model._vptr_Model =
       (_func_int **)&PTR__TreeEnsembleRegressor_0048fc80;
  this_00 = (this->super_TreeEnsembleBase).super_Model.m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_oneof_case_[0] == 0x192) {
    TVar3 = this_00->Type_;
  }
  else {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 0x192;
    uVar1 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar6 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    TVar3.treeensembleclassifier_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::TreeEnsembleClassifier>
                   (pAVar6);
    (this_00->Type_).treeensembleclassifier_ = (TreeEnsembleClassifier *)TVar3;
    this_00 = (this->super_TreeEnsembleBase).super_Model.m_spec.
              super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  this->tree_classifier_parameters = (TreeEnsembleClassifier *)TVar3;
  pMVar4 = this_00->description_;
  if (pMVar4 == (ModelDescription *)0x0) {
    uVar1 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar6 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    pMVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar6);
    this_00->description_ = pMVar4;
  }
  uVar1 = (pMVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&pMVar4->predictedfeaturename_,predictedClassOutputName,puVar5);
  peVar2 = (this->super_TreeEnsembleBase).super_Model.m_spec.
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pMVar4 = peVar2->description_;
  if (pMVar4 == (ModelDescription *)0x0) {
    uVar1 = (peVar2->super_MessageLite)._internal_metadata_.ptr_;
    pAVar6 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    pMVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar6);
    peVar2->description_ = pMVar4;
  }
  uVar1 = (pMVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&pMVar4->predictedprobabilitiesname_,classProbabilityOutputName,puVar5);
  return;
}

Assistant:

TreeEnsembleClassifier::TreeEnsembleClassifier
    (const std::string& predictedClassOutputName,
     const std::string& classProbabilityOutputName,
     const std::string& description)
    : TreeEnsembleBase(Model(description), true /* isClassifier */),
      tree_classifier_parameters(m_spec->mutable_treeensembleclassifier())
    {
        m_spec->mutable_description()->set_predictedfeaturename(predictedClassOutputName);
        m_spec->mutable_description()->set_predictedprobabilitiesname(classProbabilityOutputName);
    }